

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O0

void __thiscall
TPZSkylMatrix<double>::DecomposeColumn2(TPZSkylMatrix<double> *this,int64_t col,int64_t prevcol)

{
  int64_t iVar1;
  int64_t iVar2;
  double *pdVar3;
  double *pdVar4;
  ostream *this_00;
  void *this_01;
  long in_RDX;
  long in_RSI;
  TPZSkylMatrix<double> *in_RDI;
  double *modify;
  double sum;
  double *lastptr;
  double *run2;
  double *run1;
  int64_t minline;
  int64_t skcol;
  int64_t skprev;
  double *ptrcol;
  double *ptrprev;
  int64_t in_stack_ffffffffffffff88;
  int64_t in_stack_ffffffffffffff98;
  TPZSkylMatrix<double> *in_stack_ffffffffffffffa0;
  double dVar5;
  double *local_50;
  double *local_48;
  long local_40;
  
  iVar1 = SkyHeight(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  iVar2 = SkyHeight(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  pdVar3 = Diag(in_RDI,in_stack_ffffffffffffff88);
  pdVar4 = Diag(in_RDI,in_stack_ffffffffffffff88);
  if (in_RSI - iVar2 < in_RDX - iVar1) {
    local_40 = in_RDX - iVar1;
  }
  else {
    local_40 = in_RSI - iVar2;
  }
  if (in_RDX < local_40) {
    std::operator<<((ostream *)&std::cout,"error condition\n");
    std::ostream::flush();
  }
  else {
    local_50 = pdVar4 + (in_RSI - in_RDX);
    dVar5 = 0.0;
    pdVar4 = pdVar4 + (in_RSI - in_RDX);
    local_48 = pdVar3;
    while (local_48 = local_48 + 1, local_50 = local_50 + 1,
          local_48 != pdVar3 + in_RDX + (1 - local_40)) {
      dVar5 = *local_48 * *local_50 + dVar5;
    }
    *pdVar4 = *pdVar4 - dVar5;
    if (in_RSI == in_RDX) {
      if (ABS(*pdVar4) < 1e-25) {
        this_00 = std::operator<<((ostream *)&std::cout,
                                  "TPZSkylMatrix::DecomposeCholesky a matrix nao e positiva definida"
                                 );
        this_01 = (void *)std::ostream::operator<<(this_00,*pdVar4);
        std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
        *pdVar4 = 1e-10;
      }
      dVar5 = sqrt(*pdVar4);
      *pdVar4 = dVar5;
    }
    else {
      *pdVar4 = *pdVar4 / *pdVar3;
    }
  }
  return;
}

Assistant:

void TPZSkylMatrix<TVar>::DecomposeColumn2(int64_t col, int64_t prevcol){
    
    //Cholesky Decomposition
    TVar *ptrprev;     //Pointer to prev column
    TVar *ptrcol;      //Pointer to col column
    int64_t skprev, skcol; //prev and col Skyline height respectively
    int64_t minline;
    
    skprev = SkyHeight(prevcol);
    skcol = SkyHeight(col);
    
    ptrprev = Diag(prevcol);
    ptrcol = Diag(col);
    
    if((prevcol-skprev) > (col-skcol)){
        minline = prevcol - skprev;
    }else
    {
        minline = col - skcol;
    }
    if(minline > prevcol) {
        cout << "error condition\n";
        cout.flush();
        return;
    }
    TVar *run1 = ptrprev + 1;
    TVar *run2 = ptrcol + (col-prevcol)+1;
    TVar *lastptr = ptrprev + prevcol-minline+1;
    TVar sum = 0;
    TVar *modify = ptrcol+(col-prevcol);
    while(run1 != lastptr) sum += (*run1++)*(*run2++);
    *modify-=sum;
    if(col != prevcol){
        *modify /= *ptrprev;
    }else{
        if ( fabs(*modify) < fabs((TVar)1.e-25) ) {
            cout << "TPZSkylMatrix::DecomposeCholesky a matrix nao e positiva definida" << *modify << endl;
            *modify = ((TVar)1.e-10);
        }
        *modify=sqrt(*modify);
    }
}